

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O0

ssize_t tnt_buf_write(tnt_stream *s,char *buf,size_t size)

{
  void *__dest;
  char *p;
  size_t size_local;
  char *buf_local;
  tnt_stream *s_local;
  
  if (*(int *)((long)s->data + 0x38) == 1) {
    s_local = (tnt_stream *)0xffffffffffffffff;
  }
  else {
    __dest = (void *)(**(code **)((long)s->data + 0x20))(s,size);
    if (__dest == (void *)0x0) {
      s_local = (tnt_stream *)0xffffffffffffffff;
    }
    else {
      memcpy(__dest,buf,size);
      *(size_t *)((long)s->data + 8) = size + *(long *)((long)s->data + 8);
      s->wrcnt = s->wrcnt + 1;
      s_local = (tnt_stream *)size;
    }
  }
  return (ssize_t)s_local;
}

Assistant:

static ssize_t
tnt_buf_write(struct tnt_stream *s, const char *buf, size_t size) {
	if (TNT_SBUF_CAST(s)->as == 1) return -1;
	char *p = TNT_SBUF_CAST(s)->resize(s, size);
	if (p == NULL)
		return -1;
	memcpy(p, buf, size);
	TNT_SBUF_CAST(s)->size += size;
	s->wrcnt++;
	return size;
}